

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfChannelList.cpp
# Opt level: O0

Channel * __thiscall Imf_3_4::ChannelList::findChannel(ChannelList *this,string *name)

{
  Channel *pCVar1;
  char *in_stack_00000108;
  ChannelList *in_stack_00000110;
  
  std::__cxx11::string::c_str();
  pCVar1 = findChannel(in_stack_00000110,in_stack_00000108);
  return pCVar1;
}

Assistant:

const Channel*
ChannelList::findChannel (const string& name) const
{
    return findChannel (name.c_str ());
}